

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void __thiscall Omega_h::OpConservation::OpConservation(OpConservation *this)

{
  reference pvVar1;
  OpConservation *this_local;
  
  pvVar1 = std::array<bool,_3UL>::operator[](&(this->density).always,0);
  *pvVar1 = true;
  pvVar1 = std::array<bool,_3UL>::operator[](&(this->density).always,1);
  *pvVar1 = false;
  pvVar1 = std::array<bool,_3UL>::operator[](&(this->density).always,2);
  *pvVar1 = false;
  pvVar1 = std::array<bool,_3UL>::operator[](&(this->momentum).always,0);
  *pvVar1 = false;
  pvVar1 = std::array<bool,_3UL>::operator[](&(this->momentum).always,1);
  *pvVar1 = false;
  pvVar1 = std::array<bool,_3UL>::operator[](&(this->momentum).always,2);
  *pvVar1 = false;
  return;
}

Assistant:

OpConservation() {
    density.always[NOT_BDRY] = true;
    density.always[TOUCH_BDRY] = false;
    density.always[KEY_BDRY] = false;
    momentum.always[NOT_BDRY] = false;
    momentum.always[TOUCH_BDRY] = false;
    momentum.always[KEY_BDRY] = false;
  }